

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svrg.cc
# Opt level: O1

void SVRG::save_load(svrg *s,io_buf *model_file,bool read,bool text)

{
  ostream *poVar1;
  undefined7 in_register_00000011;
  bool resume;
  stringstream msg;
  char local_1b1;
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  if ((int)CONCAT71(in_register_00000011,read) != 0) {
    initialize_regressor(s->all);
  }
  if ((model_file->files)._end != (model_file->files)._begin) {
    local_1b1 = s->all->save_resume;
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    poVar1 = std::ostream::_M_insert<bool>(SUB81((ostream *)local_1a0,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    if (read) {
      io_buf::bin_read_fixed(model_file,&local_1b1,1,"");
    }
    else {
      bin_text_write_fixed(model_file,&local_1b1,1,(stringstream *)local_1b0,text);
    }
    if (local_1b1 == '\x01') {
      GD::save_load_online_state(s->all,model_file,read,text,(gd *)0x0);
    }
    else {
      GD::save_load_regressor(s->all,model_file,read,text);
    }
    std::__cxx11::stringstream::~stringstream(local_1b0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  }
  return;
}

Assistant:

void save_load(svrg& s, io_buf& model_file, bool read, bool text)
{
  if (read)
  {
    initialize_regressor(*s.all);
  }

  if (model_file.files.size() > 0)
  {
    bool resume = s.all->save_resume;
    stringstream msg;
    msg << ":" << resume << "\n";
    bin_text_read_write_fixed(model_file, (char*)&resume, sizeof(resume), "", read, msg, text);

    if (resume)
      GD::save_load_online_state(*s.all, model_file, read, text);
    else
      GD::save_load_regressor(*s.all, model_file, read, text);
  }
}